

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>>
          (basic_writer<fmt::v5::output_range<char_*,_char>_> *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char_*,_char>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<1>_>
          *f)

{
  undefined1 uVar1;
  uint uVar2;
  wchar_t wVar3;
  alignment aVar4;
  basic_writer<fmt::v5::output_range<char_*,_char>_> *this_00;
  char **ppcVar5;
  unsigned_long __n;
  char *pcVar6;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char_*,_char>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<1>_>
  *this_01;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char_*,_char>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<1>_>
  *in_RDX;
  align_spec *in_RSI;
  char **in_RDI;
  size_t left_padding;
  size_t padding;
  char_type fill;
  char **it;
  size_t num_code_points;
  size_t size;
  uint width;
  size_t in_stack_ffffffffffffff98;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char_*,_char>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<1>_>
  *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffc0;
  
  uVar2 = align_spec::width(in_RSI);
  this_00 = (basic_writer<fmt::v5::output_range<char_*,_char>_> *)
            basic_writer<fmt::v5::output_range<char_*,_char>_>::
            padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char_*,_char>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<1>_>
            ::size(in_RDX);
  if (uVar2 != 0) {
    this_00 = (basic_writer<fmt::v5::output_range<char_*,_char>_> *)
              basic_writer<fmt::v5::output_range<char_*,_char>_>::
              padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char_*,_char>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<1>_>
              ::width(in_RDX);
  }
  if (this_00 < (basic_writer<fmt::v5::output_range<char_*,_char>_> *)(ulong)uVar2) {
    ppcVar5 = basic_writer<fmt::v5::output_range<char_*,_char>_>::reserve
                        (this_00,in_stack_ffffffffffffff98);
    wVar3 = align_spec::fill(in_RSI);
    uVar1 = (undefined1)wVar3;
    __n = (ulong)uVar2 - (long)this_00;
    aVar4 = align_spec::align(in_RSI);
    if (aVar4 == ALIGN_RIGHT) {
      pcVar6 = std::fill_n<char*,unsigned_long,char>
                         ((char *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),__n,
                          (char *)in_stack_ffffffffffffffb0);
      *ppcVar5 = pcVar6;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
      ::operator()(in_stack_ffffffffffffffb0,in_RDI);
    }
    else {
      aVar4 = align_spec::align(in_RSI);
      if (aVar4 == ALIGN_CENTER) {
        this_01 = (padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char_*,_char>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<1>_>
                   *)(__n >> 1);
        pcVar6 = std::fill_n<char*,unsigned_long,char>
                           ((char *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),__n,(char *)this_01);
        *ppcVar5 = pcVar6;
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
        ::operator()(this_01,in_RDI);
        pcVar6 = std::fill_n<char*,unsigned_long,char>
                           ((char *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),__n,(char *)this_01);
        *ppcVar5 = pcVar6;
      }
      else {
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
        ::operator()(in_stack_ffffffffffffffb0,in_RDI);
        pcVar6 = std::fill_n<char*,unsigned_long,char>
                           ((char *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),__n,
                            (char *)in_stack_ffffffffffffffb0);
        *ppcVar5 = pcVar6;
      }
    }
  }
  else {
    basic_writer<fmt::v5::output_range<char_*,_char>_>::reserve(this_00,(size_t)in_RDX);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
    ::operator()(in_stack_ffffffffffffffb0,in_RDI);
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }